

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol.cpp
# Opt level: O0

int32_t ucol_mergeSortkeys_63
                  (uint8_t *src1,int32_t src1Length,uint8_t *src2,int32_t src2Length,uint8_t *dest,
                  int32_t destCapacity)

{
  byte bVar1;
  size_t sVar2;
  byte *pbVar3;
  byte *pbStack_48;
  uint8_t b;
  uint8_t *p;
  int32_t destLength;
  int32_t destCapacity_local;
  uint8_t *dest_local;
  byte *pbStack_28;
  int32_t src2Length_local;
  uint8_t *src2_local;
  byte *pbStack_18;
  int32_t src1Length_local;
  uint8_t *src1_local;
  
  if (((((((src1 == (uint8_t *)0x0) || (src1Length < -1)) || (src1Length == 0)) ||
        ((0 < src1Length && (src1[src1Length + -1] != '\0')))) ||
       ((src2 == (uint8_t *)0x0 || ((src2Length < -1 || (src2Length == 0)))))) ||
      ((0 < src2Length && (src2[src2Length + -1] != '\0')))) ||
     ((destCapacity < 0 || ((0 < destCapacity && (dest == (uint8_t *)0x0)))))) {
    if ((dest != (uint8_t *)0x0) && (0 < destCapacity)) {
      *dest = '\0';
    }
    src1_local._4_4_ = 0;
  }
  else {
    src2_local._4_4_ = src1Length;
    if (src1Length < 0) {
      sVar2 = strlen((char *)src1);
      src2_local._4_4_ = (int)sVar2 + 1;
    }
    dest_local._4_4_ = src2Length;
    if (src2Length < 0) {
      sVar2 = strlen((char *)src2);
      dest_local._4_4_ = (int)sVar2 + 1;
    }
    src1_local._4_4_ = src2_local._4_4_ + dest_local._4_4_;
    pbStack_48 = dest;
    pbStack_18 = src1;
    pbStack_28 = src2;
    if (src1_local._4_4_ <= destCapacity) {
      while( true ) {
        while (bVar1 = *pbStack_18, 1 < bVar1) {
          pbStack_18 = pbStack_18 + 1;
          *pbStack_48 = bVar1;
          pbStack_48 = pbStack_48 + 1;
        }
        *pbStack_48 = 2;
        pbVar3 = pbStack_48;
        while( true ) {
          pbStack_48 = pbVar3 + 1;
          bVar1 = *pbStack_28;
          if (bVar1 < 2) break;
          pbStack_28 = pbStack_28 + 1;
          *pbStack_48 = bVar1;
          pbVar3 = pbStack_48;
        }
        if ((*pbStack_18 != 1) || (*pbStack_28 != 1)) break;
        pbStack_18 = pbStack_18 + 1;
        pbStack_28 = pbStack_28 + 1;
        *pbStack_48 = 1;
        pbStack_48 = pbVar3 + 2;
      }
      if (*pbStack_18 != 0) {
        pbStack_28 = pbStack_18;
      }
      do {
        bVar1 = *pbStack_28;
        pbVar3 = pbStack_48 + 1;
        *pbStack_48 = bVar1;
        pbStack_48 = pbVar3;
        pbStack_28 = pbStack_28 + 1;
      } while (bVar1 != 0);
      src1_local._4_4_ = (int)pbVar3 - (int)dest;
    }
  }
  return src1_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_mergeSortkeys(const uint8_t *src1, int32_t src1Length,
                   const uint8_t *src2, int32_t src2Length,
                   uint8_t *dest, int32_t destCapacity) {
    /* check arguments */
    if( src1==NULL || src1Length<-1 || src1Length==0 || (src1Length>0 && src1[src1Length-1]!=0) ||
        src2==NULL || src2Length<-1 || src2Length==0 || (src2Length>0 && src2[src2Length-1]!=0) ||
        destCapacity<0 || (destCapacity>0 && dest==NULL)
    ) {
        /* error, attempt to write a zero byte and return 0 */
        if(dest!=NULL && destCapacity>0) {
            *dest=0;
        }
        return 0;
    }

    /* check lengths and capacity */
    if(src1Length<0) {
        src1Length=(int32_t)uprv_strlen((const char *)src1)+1;
    }
    if(src2Length<0) {
        src2Length=(int32_t)uprv_strlen((const char *)src2)+1;
    }

    int32_t destLength=src1Length+src2Length;
    if(destLength>destCapacity) {
        /* the merged sort key does not fit into the destination */
        return destLength;
    }

    /* merge the sort keys with the same number of levels */
    uint8_t *p=dest;
    for(;;) {
        /* copy level from src1 not including 00 or 01 */
        uint8_t b;
        while((b=*src1)>=2) {
            ++src1;
            *p++=b;
        }

        /* add a 02 merge separator */
        *p++=2;

        /* copy level from src2 not including 00 or 01 */
        while((b=*src2)>=2) {
            ++src2;
            *p++=b;
        }

        /* if both sort keys have another level, then add a 01 level separator and continue */
        if(*src1==1 && *src2==1) {
            ++src1;
            ++src2;
            *p++=1;
        } else {
            break;
        }
    }

    /*
     * here, at least one sort key is finished now, but the other one
     * might have some contents left from containing more levels;
     * that contents is just appended to the result
     */
    if(*src1!=0) {
        /* src1 is not finished, therefore *src2==0, and src1 is appended */
        src2=src1;
    }
    /* append src2, "the other, unfinished sort key" */
    while((*p++=*src2++)!=0) {}

    /* the actual length might be less than destLength if either sort key contained illegally embedded zero bytes */
    return (int32_t)(p-dest);
}